

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O0

void __thiscall (anonymous_namespace)::AV1ResizeXTest::~AV1ResizeXTest(AV1ResizeXTest *this)

{
  anon_unknown.dwarf_122557b::AV1ResizeXTest::~AV1ResizeXTest((AV1ResizeXTest *)(this + -0x10));
  return;
}

Assistant:

void SetUp() {
    test_fun_ = GET_PARAM(0);
    frame_dim_ = GET_PARAM(1);
    width_ = std::get<0>(frame_dim_);
    height_ = std::get<1>(frame_dim_);
    const int msb = get_msb(AOMMIN(width_, height_));
    n_levels_ = AOMMAX(msb - MIN_PYRAMID_SIZE_LOG2, 1);
    const int src_buf_size = width_ * height_;
    const int dest_buf_size = (width_ * height_) / 2;
    src_ = std::unique_ptr<uint8_t[]>(new (std::nothrow) uint8_t[src_buf_size]);
    ASSERT_NE(src_, nullptr);

    ref_dest_ =
        std::unique_ptr<uint8_t[]>(new (std::nothrow) uint8_t[dest_buf_size]);
    ASSERT_NE(ref_dest_, nullptr);

    test_dest_ =
        std::unique_ptr<uint8_t[]>(new (std::nothrow) uint8_t[dest_buf_size]);
    ASSERT_NE(test_dest_, nullptr);
  }